

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticGraphics.c
# Opt level: O1

void plot_statics_and_menu_text(tgestate_t *state)

{
  screenlocstring_t *slstring;
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    iVar1 = 0xff;
    if (-1 < (char)(&static_graphic_defs[0].flags_and_length)[lVar2]) {
      iVar1 = 0;
    }
    plot_static_tiles(state,(state->speccy->screen).pixels +
                            *(ushort *)((long)&static_graphic_defs[0].screenloc + lVar2),
                      (statictileline_t *)((long)&static_graphic_defs[0].screenloc + lVar2),iVar1);
    lVar2 = lVar2 + 0x10;
  } while ((int)lVar2 != 0x120);
  slstring = plot_statics_and_menu_text::key_choice_screenlocstrings;
  iVar1 = -8;
  do {
    slstring = screenlocstring_plot(state,slstring);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void plot_statics_and_menu_text(tgestate_t *state)
{
  /**
   * $F446: Key choice screenlocstrings.
   */
  static const screenlocstring_t key_choice_screenlocstrings[] =
  {
    { 0x008E,  8, "CONTROLS"                },
    { 0x00CD,  8, "0 SELECT"                },
    { 0x080D, 10, "1 KEYBOARD"              },
    { 0x084D, 10, "2 KEMPSTON"              },
    { 0x088D, 10, "3 SINCLAIR"              },
    { 0x08CD,  8, "4 PROTEK"                },
    { 0x1007, 23, "BREAK OR CAPS AND SPACE" },
    { 0x102C, 12, "FOR NEW GAME"            },
  };

  const statictileline_t  *stline;    /* was HL */
  int                      iters;     /* was B */
  uint8_t                 *screenptr; /* was DE */
  const screenlocstring_t *slstring;  /* was HL */

  assert(state != NULL);

  /* Plot statics and menu text. */
  stline = &static_graphic_defs[0];
  iters  = NELEMS(static_graphic_defs);
  do
  {
    screenptr = &state->speccy->screen.pixels[stline->screenloc]; /* Fetch screen address offset. */
    ASSERT_SCREEN_PTR_VALID(screenptr);

    if (stline->flags_and_length & statictileline_VERTICAL)
      plot_static_tiles_vertical(state, screenptr, stline);
    else
      plot_static_tiles_horizontal(state, screenptr, stline);
    stline++;
  }
  while (--iters);

  /* Plot menu text. */
  iters    = NELEMS(key_choice_screenlocstrings);
  slstring = &key_choice_screenlocstrings[0];
  do
    slstring = screenlocstring_plot(state, slstring);
  while (--iters);
}